

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  seqStore_t *psVar4;
  U32 lowestValid;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  int *piVar10;
  ZSTD_matchState_t *ms_00;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  seqDef *psVar18;
  uint local_a8;
  uint local_a4;
  size_t offbaseFound;
  ZSTD_matchState_t *local_98;
  int *local_90;
  int *local_88;
  uint local_7c;
  int *local_78;
  int *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  int *local_58;
  seqStore_t *local_50;
  BYTE *local_48;
  uint *local_40;
  long local_38;
  
  pBVar17 = (ms->window).base;
  uVar15 = (ms->window).dictLimit;
  local_48 = pBVar17 + uVar15;
  uVar11 = (ms->cParams).minMatch;
  uVar14 = 6;
  if (uVar11 < 6) {
    uVar14 = uVar11;
  }
  local_7c = 4;
  if (4 < uVar14) {
    local_7c = uVar14;
  }
  local_5c = *rep;
  piVar8 = (int *)((ulong)((int)src == (int)local_48) + (long)src);
  iVar12 = (int)piVar8 - (int)pBVar17;
  uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_60 = iVar12 - uVar11;
  if (iVar12 - uVar15 <= uVar11) {
    local_60 = uVar15;
  }
  if (ms->loadedDictEnd != 0) {
    local_60 = uVar15;
  }
  local_64 = rep[1];
  local_60 = iVar12 - local_60;
  local_a4 = local_64;
  if (local_60 < local_64) {
    local_a4 = 0;
  }
  local_a8 = local_5c;
  if (local_60 < local_5c) {
    local_a8 = 0;
  }
  ms->lazySkipping = 0;
  piVar10 = (int *)((long)src + srcSize);
  local_70 = (int *)((long)src + (srcSize - 8));
  local_78 = (int *)((long)src + (srcSize - 0x20));
  local_98 = ms;
  local_90 = piVar10;
  local_50 = seqStore;
  local_40 = rep;
  do {
    ms_00 = local_98;
    lVar9 = -(ulong)local_a8;
    while( true ) {
      if (local_70 <= piVar8) {
        if (local_64 <= local_60) {
          local_64 = 0;
        }
        uVar15 = local_64;
        if (local_a8 != 0) {
          uVar15 = local_5c;
        }
        if (local_5c <= local_60) {
          uVar15 = local_64;
          local_5c = 0;
        }
        if (local_a8 != 0) {
          local_5c = local_a8;
        }
        if (local_a4 != 0) {
          uVar15 = local_a4;
        }
        *local_40 = local_5c;
        local_40[1] = uVar15;
        return (long)piVar10 - (long)src;
      }
      if (local_a8 == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = 0;
        if (*(int *)((long)piVar8 + lVar9 + 1) == *(int *)((long)piVar8 + 1)) {
          sVar5 = ZSTD_count((BYTE *)((long)piVar8 + 5),(BYTE *)((long)piVar8 + lVar9 + 5),
                             (BYTE *)piVar10);
          uVar16 = sVar5 + 4;
        }
      }
      offbaseFound = 999999999;
      if (local_7c == 6) {
        uVar6 = ZSTD_HcFindBestMatch_noDict_6(ms_00,(BYTE *)piVar8,(BYTE *)piVar10,&offbaseFound);
      }
      else if (local_7c == 5) {
        uVar6 = ZSTD_HcFindBestMatch_noDict_5(ms_00,(BYTE *)piVar8,(BYTE *)piVar10,&offbaseFound);
      }
      else {
        uVar6 = ZSTD_HcFindBestMatch_noDict_4(ms_00,(BYTE *)piVar8,(BYTE *)piVar10,&offbaseFound);
      }
      psVar4 = local_50;
      uVar7 = uVar16;
      if (uVar16 < uVar6) {
        uVar7 = uVar6;
      }
      if (3 < uVar7) break;
      uVar16 = (long)piVar8 - (long)src;
      piVar8 = (int *)((long)piVar8 + (uVar16 >> 8) + 1);
      ms_00->lazySkipping = (uint)(0x7ff < uVar16);
      piVar10 = local_90;
    }
    local_88 = (int *)((long)piVar8 + 1);
    uVar13 = 1;
    if (uVar16 < uVar6) {
      local_88 = piVar8;
      uVar13 = offbaseFound;
    }
    local_38 = lVar9;
    for (pBVar17 = (BYTE *)((long)piVar8 + 5); uVar16 = uVar7, pBVar17 + -5 < local_70;
        pBVar17 = pBVar17 + 1) {
      piVar10 = (int *)(pBVar17 + -4);
      if (uVar13 == 0) {
        uVar13 = 0;
      }
      else if ((local_a8 != 0) && (*(int *)(pBVar17 + -4) == *(int *)(pBVar17 + local_38 + -4))) {
        local_58 = piVar10;
        sVar5 = ZSTD_count(pBVar17,pBVar17 + local_38,(BYTE *)local_90);
        piVar10 = local_58;
        if (sVar5 < 0xfffffffffffffffc) {
          uVar15 = 0x1f;
          if ((uint)uVar13 != 0) {
            for (; (uint)uVar13 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          if ((int)((uVar15 ^ 0x1f) + (int)uVar7 * 3 + -0x1e) < (int)(sVar5 + 4) * 3) {
            local_88 = local_58;
            uVar13 = 1;
            uVar16 = sVar5 + 4;
          }
        }
      }
      offbaseFound = 999999999;
      if (local_7c == 6) {
        uVar7 = ZSTD_HcFindBestMatch_noDict_6
                          (local_98,(BYTE *)piVar10,(BYTE *)local_90,&offbaseFound);
      }
      else if (local_7c == 5) {
        uVar7 = ZSTD_HcFindBestMatch_noDict_5
                          (local_98,(BYTE *)piVar10,(BYTE *)local_90,&offbaseFound);
      }
      else {
        uVar7 = ZSTD_HcFindBestMatch_noDict_4
                          (local_98,(BYTE *)piVar10,(BYTE *)local_90,&offbaseFound);
      }
      ms_00 = local_98;
      if (uVar7 < 4) break;
      uVar15 = 0x1f;
      if ((uint)uVar13 != 0) {
        for (; (uint)uVar13 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      iVar12 = 0x1f;
      if ((uint)offbaseFound != 0) {
        for (; (uint)offbaseFound >> iVar12 == 0; iVar12 = iVar12 + -1) {
        }
      }
      if ((int)uVar7 * 4 - iVar12 <= (int)((uVar15 ^ 0x1f) + (int)uVar16 * 4 + -0x1b)) break;
      piVar8 = (int *)((long)piVar8 + 1);
      uVar13 = offbaseFound;
      local_88 = piVar8;
    }
    piVar8 = local_88;
    uVar15 = local_a8;
    if (3 < uVar13) {
      for (; ((src < piVar8 && (local_48 < (BYTE *)((long)piVar8 + (3 - uVar13)))) &&
             (*(char *)((long)piVar8 + -1) == *(char *)((long)piVar8 + (2 - uVar13))));
          piVar8 = (int *)((long)piVar8 + -1)) {
        uVar16 = uVar16 + 1;
      }
      uVar15 = (U32)uVar13 - 3;
      local_a4 = local_a8;
    }
    if (psVar4->maxNbSeq <= (ulong)((long)psVar4->sequences - (long)psVar4->sequencesStart >> 3)) {
LAB_00148814:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < psVar4->maxNbLit) {
LAB_00148833:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar6 = (long)piVar8 - (long)src;
    pBVar17 = psVar4->lit;
    if (psVar4->litStart + psVar4->maxNbLit < pBVar17 + uVar6) {
LAB_00148852:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_90 < piVar8) {
LAB_00148871:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_78 < piVar8) {
      local_88 = piVar8;
      ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)piVar8,(BYTE *)local_78);
      piVar8 = local_88;
LAB_00148584:
      psVar4->lit = psVar4->lit + uVar6;
      if (0xffff < uVar6) {
        if (psVar4->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar4->longLengthType = ZSTD_llt_literalLength;
        psVar4->longLengthPos =
             (U32)((ulong)((long)psVar4->sequences - (long)psVar4->sequencesStart) >> 3);
      }
    }
    else {
      uVar3 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar17 = *src;
      *(undefined8 *)(pBVar17 + 8) = uVar3;
      pBVar17 = psVar4->lit;
      if (0x10 < uVar6) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar3 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar17 + 0x18) = uVar3;
        if (0x20 < (long)uVar6) {
          lVar9 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar9 + 0x20);
            uVar3 = puVar2[1];
            pBVar1 = pBVar17 + lVar9 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar3;
            puVar2 = (undefined8 *)((long)src + lVar9 + 0x30);
            uVar3 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar3;
            lVar9 = lVar9 + 0x20;
          } while (pBVar1 + 0x20 < pBVar17 + uVar6);
        }
        goto LAB_00148584;
      }
      psVar4->lit = pBVar17 + uVar6;
    }
    piVar10 = local_90;
    psVar18 = psVar4->sequences;
    psVar18->litLength = (U16)uVar6;
    psVar18->offBase = (U32)uVar13;
    if (uVar16 < 3) {
LAB_00148890:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar16 - 3) {
      if (psVar4->longLengthType != ZSTD_llt_none) {
LAB_001488af:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      psVar4->longLengthType = ZSTD_llt_matchLength;
      psVar4->longLengthPos = (U32)((ulong)((long)psVar18 - (long)psVar4->sequencesStart) >> 3);
    }
    psVar18->mlBase = (U16)(uVar16 - 3);
    psVar18 = psVar18 + 1;
    psVar4->sequences = psVar18;
    if (ms_00->lazySkipping != 0) {
      ms_00->lazySkipping = 0;
    }
    uVar11 = local_a4;
    local_a8 = uVar15;
    for (piVar8 = (int *)((long)piVar8 + uVar16);
        ((local_a4 = uVar11, src = piVar8, local_a4 != 0 && (piVar8 <= local_70)) &&
        (*piVar8 == *(int *)((long)piVar8 - (ulong)local_a4)));
        piVar8 = (int *)((long)piVar8 + sVar5 + 4)) {
      sVar5 = ZSTD_count((BYTE *)(piVar8 + 1),(BYTE *)((long)piVar8 + (4 - (ulong)local_a4)),
                         (BYTE *)piVar10);
      if (psVar4->maxNbSeq <= (ulong)((long)psVar18 - (long)psVar4->sequencesStart >> 3))
      goto LAB_00148814;
      if (0x20000 < psVar4->maxNbLit) goto LAB_00148833;
      pBVar17 = psVar4->lit;
      if (psVar4->litStart + psVar4->maxNbLit < pBVar17) goto LAB_00148852;
      if (piVar10 < piVar8) goto LAB_00148871;
      if (local_78 < piVar8) {
        ZSTD_safecopyLiterals(pBVar17,(BYTE *)piVar8,(BYTE *)piVar8,(BYTE *)local_78);
      }
      else {
        uVar3 = *(undefined8 *)(piVar8 + 2);
        *(undefined8 *)pBVar17 = *(undefined8 *)piVar8;
        *(undefined8 *)(pBVar17 + 8) = uVar3;
      }
      psVar18 = psVar4->sequences;
      psVar18->litLength = 0;
      psVar18->offBase = 1;
      if (sVar5 + 4 < 3) goto LAB_00148890;
      if (0xffff < sVar5 + 1) {
        if (psVar4->longLengthType != ZSTD_llt_none) goto LAB_001488af;
        psVar4->longLengthType = ZSTD_llt_matchLength;
        psVar4->longLengthPos = (U32)((ulong)((long)psVar18 - (long)psVar4->sequencesStart) >> 3);
      }
      psVar18->mlBase = (U16)(sVar5 + 1);
      psVar18 = psVar18 + 1;
      psVar4->sequences = psVar18;
      uVar11 = local_a8;
      local_a8 = local_a4;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_noDict);
}